

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQArray::Extend(SQArray *this,SQArray *a)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  
  SVar2 = (a->_values)._size;
  if (0 < (long)SVar2) {
    lVar1 = 0;
    do {
      Append(this,(SQObject *)((long)&(((a->_values)._vals)->super_SQObject)._type + lVar1));
      lVar1 = lVar1 + 0x10;
      SVar2 = SVar2 - 1;
    } while (SVar2 != 0);
  }
  return;
}

Assistant:

SQUnsignedInteger TranslateIndex(const SQObjectPtr &idx)
{
    switch(type(idx)){
        case OT_NULL:
            return 0;
        case OT_INTEGER:
            return (SQUnsignedInteger)_integer(idx);
        default: assert(0); break;
    }
    return 0;
}